

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall
CTcSymObjBase::add_vocab_word(CTcSymObjBase *this,char *txt,size_t len,tctarg_prop_id_t prop)

{
  CTcVocabEntry *pCVar1;
  
  pCVar1 = (CTcVocabEntry *)CTcPrsMem::alloc(G_prsmem,0x20);
  pCVar1->txt_ = txt;
  pCVar1->len_ = len;
  pCVar1->prop_ = prop;
  pCVar1->nxt_ = (CTcVocabEntry *)0x0;
  pCVar1->nxt_ = this->vocab_;
  this->vocab_ = pCVar1;
  return;
}

Assistant:

void CTcSymObjBase::add_vocab_word(const char *txt, size_t len,
                                   tctarg_prop_id_t prop)
{
    /* create a new vocabulary entry */
    CTcVocabEntry *entry = new (G_prsmem) CTcVocabEntry(txt, len, prop);

    /* link it into my list */
    entry->nxt_ = vocab_;
    vocab_ = entry;
}